

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase336::run(TestCase336 *this)

{
  uint *params_2;
  long lVar1;
  Array<unsigned_int> bar;
  Fault f;
  
  params_2 = _::HeapArrayDisposer::allocateUninitialized<unsigned_int>(4);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    *(int *)((long)params_2 + lVar1) =
         *(int *)((long)&DAT_001879d0 + lVar1) * *(int *)((long)&DAT_001879d0 + lVar1);
  }
  bar.size_ = 4;
  bar.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  f.exception = (Exception *)0x0;
  bar.ptr = params_2;
  ArrayBuilder<unsigned_int>::dispose((ArrayBuilder<unsigned_int> *)&f);
  if (_::Debug::minSeverity < 3 && *params_2 != 1) {
    f.exception._0_4_ = 1;
    _::Debug::log<char_const(&)[33],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x154,ERROR,"\"failed: expected \" \"(1) == (bar[0])\", 1, bar[0]",
               (char (*) [33])"failed: expected (1) == (bar[0])",(int *)&f,params_2);
    params_2 = bar.ptr;
  }
  if (_::Debug::minSeverity < 3 && params_2[1] != 4) {
    f.exception._0_4_ = 4;
    _::Debug::log<char_const(&)[33],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x155,ERROR,"\"failed: expected \" \"(4) == (bar[1])\", 4, bar[1]",
               (char (*) [33])"failed: expected (4) == (bar[1])",(int *)&f,params_2 + 1);
    params_2 = bar.ptr;
  }
  if (_::Debug::minSeverity < 3 && params_2[2] != 9) {
    f.exception._0_4_ = 9;
    _::Debug::log<char_const(&)[33],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x156,ERROR,"\"failed: expected \" \"(9) == (bar[2])\", 9, bar[2]",
               (char (*) [33])"failed: expected (9) == (bar[2])",(int *)&f,params_2 + 2);
    params_2 = bar.ptr;
  }
  if ((params_2[3] != 0x10) && (_::Debug::minSeverity < 3)) {
    f.exception._0_4_ = 0x10;
    _::Debug::log<char_const(&)[34],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x157,ERROR,"\"failed: expected \" \"(16) == (bar[3])\", 16, bar[3]",
               (char (*) [34])"failed: expected (16) == (bar[3])",(int *)&f,params_2 + 3);
  }
  Array<unsigned_int>::~Array(&bar);
  return;
}

Assistant:

TEST(Array, MapRawArray) {
  uint foo[4] = {1, 2, 3, 4};
  Array<uint> bar = KJ_MAP(i, foo) -> uint { return i * i; };
  ASSERT_EQ(4, bar.size());
  EXPECT_EQ(1, bar[0]);
  EXPECT_EQ(4, bar[1]);
  EXPECT_EQ(9, bar[2]);
  EXPECT_EQ(16, bar[3]);
}